

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool __thiscall
tinyobj::MaterialStreamReader::operator()
          (MaterialStreamReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  bool bVar1;
  ulong uVar2;
  ostream *this_00;
  undefined1 local_210 [8];
  string warning;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [376];
  string *local_38;
  string *err_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *matMap_local;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials_local;
  string *matId_local;
  MaterialStreamReader *this_local;
  
  local_38 = err;
  err_local = (string *)matMap;
  matMap_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)materials;
  materials_local = (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)matId;
  matId_local = (string *)this;
  uVar2 = std::ios::operator!((ios *)(this->m_inStream +
                                     *(long *)(*(long *)this->m_inStream + -0x18)));
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_210);
    LoadMtl((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)err_local,
            (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)matMap_local,
            this->m_inStream,(string *)local_210);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210);
    if ((!bVar1) &&
       (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_210);
    }
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_210);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c0);
    this_00 = std::operator<<(local_1b0,"WARN: Material stream in error state. ");
    std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
    if (local_38 != (string *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&warning.field_2 + 8));
      std::__cxx11::string::~string((string *)(warning.field_2._M_local_buf + 8));
    }
    this_local._7_1_ = 0;
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MaterialStreamReader::operator()(const std::string &matId,
                                      std::vector<material_t> *materials,
                                      std::map<std::string, int> *matMap,
                                      std::string *err) {
  (void)matId;
  if (!m_inStream) {
    std::stringstream ss;
    ss << "WARN: Material stream in error state. " << std::endl;
    if (err) {
      (*err) += ss.str();
    }
    return false;
  }

  std::string warning;
  LoadMtl(matMap, materials, &m_inStream, &warning);

  if (!warning.empty()) {
    if (err) {
      (*err) += warning;
    }
  }

  return true;
}